

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

int __thiscall
zmq::socket_base_t::getsockopt
          (socket_base_t *this,int __fd,int __level,int __optname,void *__optval,socklen_t *__optlen
          )

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined4 in_register_0000000c;
  undefined8 uVar4;
  undefined4 in_register_00000014;
  socket_base_t *this_00;
  char *errstr;
  int rc;
  scoped_optional_lock_t sync_lock;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff60;
  size_t *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  int local_4;
  
  this_00 = (socket_base_t *)CONCAT44(in_register_00000014,__level);
  uVar4 = CONCAT44(in_register_0000000c,__optname);
  scoped_optional_lock_t::scoped_optional_lock_t
            ((scoped_optional_lock_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
             ,(mutex_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if ((this->_ctx_terminated & 1U) == 0) {
    if (__fd == 0xd) {
      local_4 = do_getsockopt<int>((void *)CONCAT44(in_stack_ffffffffffffff54,
                                                    in_stack_ffffffffffffff50),
                                   (size_t *)
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    }
    else if (__fd == 0xe) {
      if ((this->_thread_safe & 1U) == 0) {
        mailbox_t::get_fd((mailbox_t *)0x2cff29);
        local_4 = do_getsockopt<int>((void *)CONCAT44(in_stack_ffffffffffffff54,
                                                      in_stack_ffffffffffffff50),
                                     (size_t *)
                                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0
                                    );
      }
      else {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        local_4 = -1;
      }
    }
    else if (__fd == 0xf) {
      iVar1 = process_commands(this_00,(int)((ulong)uVar4 >> 0x20),SUB81((ulong)uVar4 >> 0x18,0));
      if ((iVar1 == 0) ||
         ((piVar2 = __errno_location(), *piVar2 != 4 &&
          (piVar2 = __errno_location(), *piVar2 != 0x9523dfd)))) {
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                  ,0x1e4);
          fflush(_stderr);
          zmq_abort((char *)0x2d0031);
        }
        has_out((socket_base_t *)0x2d005d);
        has_in((socket_base_t *)0x2d007d);
        in_stack_ffffffffffffff54 =
             do_getsockopt<int>((void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ),
                                (size_t *)
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
        local_4 = in_stack_ffffffffffffff54;
      }
      else {
        local_4 = -1;
      }
    }
    else if (__fd == 0x20) {
      in_stack_ffffffffffffff50 =
           do_getsockopt((void *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      local_4 = in_stack_ffffffffffffff50;
    }
    else if (__fd == 0x51) {
      local_4 = do_getsockopt<int>((void *)CONCAT44(in_stack_ffffffffffffff54,
                                                    in_stack_ffffffffffffff50),
                                   (size_t *)
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    }
    else {
      local_4 = options_t::getsockopt
                          (&(this->super_own_t).options,__fd,(int)this_00,(int)uVar4,__optval,
                           __optlen);
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x9523dfd;
    local_4 = -1;
  }
  scoped_optional_lock_t::~scoped_optional_lock_t
            ((scoped_optional_lock_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
            );
  return local_4;
}

Assistant:

int zmq::socket_base_t::getsockopt (int option_,
                                    void *optval_,
                                    size_t *optvallen_)
{
    scoped_optional_lock_t sync_lock (_thread_safe ? &_sync : NULL);

    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    if (option_ == ZMQ_RCVMORE) {
        return do_getsockopt<int> (optval_, optvallen_, _rcvmore ? 1 : 0);
    }

    if (option_ == ZMQ_FD) {
        if (_thread_safe) {
            // thread safe socket doesn't provide file descriptor
            errno = EINVAL;
            return -1;
        }

        return do_getsockopt<fd_t> (
          optval_, optvallen_,
          (static_cast<mailbox_t *> (_mailbox))->get_fd ());
    }

    if (option_ == ZMQ_EVENTS) {
        const int rc = process_commands (0, false);
        if (rc != 0 && (errno == EINTR || errno == ETERM)) {
            return -1;
        }
        errno_assert (rc == 0);

        return do_getsockopt<int> (optval_, optvallen_,
                                   (has_out () ? ZMQ_POLLOUT : 0)
                                     | (has_in () ? ZMQ_POLLIN : 0));
    }

    if (option_ == ZMQ_LAST_ENDPOINT) {
        return do_getsockopt (optval_, optvallen_, _last_endpoint);
    }

    if (option_ == ZMQ_THREAD_SAFE) {
        return do_getsockopt<int> (optval_, optvallen_, _thread_safe ? 1 : 0);
    }

    return options.getsockopt (option_, optval_, optvallen_);
}